

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerBailOnNegative(Lowerer *this,Instr *instr)

{
  Instr *insertBeforeInstr;
  Func *func;
  code *pcVar1;
  bool bVar2;
  BailOutKind bailOutKindToLower;
  undefined4 *puVar3;
  LabelInstr *target;
  Opnd *pOVar4;
  IntConstOpnd *compareSrc2;
  Lowerer *this_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31aa,"(instr)","instr");
    if (!bVar2) goto LAB_005bafd0;
    *puVar3 = 0;
  }
  if (instr->m_opcode != BailOnNegative) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31ab,"(instr->m_opcode == Js::OpCode::BailOnNegative)",
                       "instr->m_opcode == Js::OpCode::BailOnNegative");
    if (!bVar2) goto LAB_005bafd0;
    *puVar3 = 0;
  }
  if ((instr->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31ac,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar2) goto LAB_005bafd0;
    *puVar3 = 0;
  }
  if (instr->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31ad,"(!instr->GetDst())","!instr->GetDst()");
    if (!bVar2) goto LAB_005bafd0;
    *puVar3 = 0;
  }
  pOVar4 = instr->m_src1;
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31ae,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) goto LAB_005bafd0;
    *puVar3 = 0;
    pOVar4 = instr->m_src1;
  }
  if ((pOVar4->m_type | TyInt64) != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31af,
                       "(instr->GetSrc1()->GetType() == TyInt32 || instr->GetSrc1()->GetType() == TyUint32)"
                       ,
                       "instr->GetSrc1()->GetType() == TyInt32 || instr->GetSrc1()->GetType() == TyUint32"
                      );
    if (!bVar2) goto LAB_005bafd0;
    *puVar3 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31b0,"(!instr->GetSrc2())","!instr->GetSrc2()");
    if (!bVar2) goto LAB_005bafd0;
    *puVar3 = 0;
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,false);
  bailOutKindToLower = IR::Instr::GetBailOutKind(instr);
  LowerOneBailOutKind(this,instr,bailOutKindToLower,false,false);
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x31b4,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar2) {
LAB_005bafd0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  insertBeforeInstr = instr->m_next;
  func = instr->m_func;
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  this_00 = (Lowerer *)0x0;
  compareSrc2 = IR::IntConstOpnd::New(0,TyInt32,func,true);
  InsertCompareBranch(this_00,pOVar4,&compareSrc2->super_Opnd,BrGe_A,false,target,insertBeforeInstr,
                      false);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void Lowerer::LowerBailOnNegative(IR::Instr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BailOnNegative);
    Assert(instr->HasBailOutInfo());
    Assert(!instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc1()->GetType() == TyInt32 || instr->GetSrc1()->GetType() == TyUint32);
    Assert(!instr->GetSrc2());

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(false);
    LowerOneBailOutKind(instr, instr->GetBailOutKind(), false);
    Assert(!instr->HasBailOutInfo());
    IR::Instr *insertBeforeInstr = instr->m_next;

    Func *const func = instr->m_func;

    //     test src, src
    //     jns  $skipBailOut
    InsertCompareBranch(
        instr->UnlinkSrc1(),
        IR::IntConstOpnd::New(0, TyInt32, func, true),
        Js::OpCode::BrGe_A,
        skipBailOutLabel,
        insertBeforeInstr);

    instr->Remove();
}